

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<unsigned_int,unsigned_int,unsigned_int,duckdb::ExclusiveBetweenOperator,false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  unsigned_long *puVar11;
  unsigned_long *puVar12;
  unsigned_long *puVar13;
  sel_t *psVar14;
  sel_t *psVar15;
  idx_t iVar16;
  bool bVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar19 = 0;
      }
      else {
        psVar7 = sel->sel_vector;
        psVar8 = pSVar1->sel_vector;
        psVar9 = pSVar3->sel_vector;
        psVar10 = pSVar5->sel_vector;
        puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar14 = false_sel->sel_vector;
        lVar19 = 0;
        uVar22 = 0;
        do {
          uVar23 = uVar22;
          if (psVar7 != (sel_t *)0x0) {
            uVar23 = (ulong)psVar7[uVar22];
          }
          uVar21 = uVar22;
          if (psVar8 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar8[uVar22];
          }
          uVar18 = uVar22;
          if (psVar9 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar9[uVar22];
          }
          uVar20 = uVar22;
          if (psVar10 != (sel_t *)0x0) {
            uVar20 = (ulong)psVar10[uVar22];
          }
          if ((((puVar11 == (unsigned_long *)0x0) ||
               ((puVar11[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) &&
              ((puVar12 == (unsigned_long *)0x0 ||
               ((puVar12[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) &&
             ((puVar13 == (unsigned_long *)0x0 ||
              ((puVar13[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)))) {
            uVar21 = (ulong)(*(uint *)(pdVar6 + uVar20 * 4) <= *(uint *)(pdVar2 + uVar21 * 4) ||
                            *(uint *)(pdVar2 + uVar21 * 4) <= *(uint *)(pdVar4 + uVar18 * 4));
          }
          else {
            uVar21 = 1;
          }
          psVar14[lVar19] = (sel_t)uVar23;
          lVar19 = lVar19 + uVar21;
          uVar22 = uVar22 + 1;
        } while (count != uVar22);
      }
      return count - lVar19;
    }
    if (count != 0) {
      psVar7 = sel->sel_vector;
      psVar8 = pSVar1->sel_vector;
      psVar9 = pSVar3->sel_vector;
      psVar10 = pSVar5->sel_vector;
      puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar14 = true_sel->sel_vector;
      iVar16 = 0;
      uVar22 = 0;
      do {
        uVar23 = uVar22;
        if (psVar7 != (sel_t *)0x0) {
          uVar23 = (ulong)psVar7[uVar22];
        }
        uVar21 = uVar22;
        if (psVar8 != (sel_t *)0x0) {
          uVar21 = (ulong)psVar8[uVar22];
        }
        uVar18 = uVar22;
        if (psVar9 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar9[uVar22];
        }
        uVar20 = uVar22;
        if (psVar10 != (sel_t *)0x0) {
          uVar20 = (ulong)psVar10[uVar22];
        }
        if ((((puVar11 == (unsigned_long *)0x0) ||
             ((puVar11[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) &&
            ((puVar12 == (unsigned_long *)0x0 ||
             ((puVar12[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) &&
           ((puVar13 == (unsigned_long *)0x0 || ((puVar13[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)
            ))) {
          uVar21 = (ulong)(*(uint *)(pdVar2 + uVar21 * 4) < *(uint *)(pdVar6 + uVar20 * 4) &&
                          *(uint *)(pdVar4 + uVar18 * 4) < *(uint *)(pdVar2 + uVar21 * 4));
        }
        else {
          uVar21 = 0;
        }
        psVar14[iVar16] = (sel_t)uVar23;
        iVar16 = iVar16 + uVar21;
        uVar22 = uVar22 + 1;
      } while (count != uVar22);
      return iVar16;
    }
  }
  else if (count != 0) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar1->sel_vector;
    psVar9 = pSVar3->sel_vector;
    psVar10 = pSVar5->sel_vector;
    puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar14 = true_sel->sel_vector;
    psVar15 = false_sel->sel_vector;
    iVar16 = 0;
    lVar19 = 0;
    uVar22 = 0;
    do {
      uVar23 = uVar22;
      if (psVar7 != (sel_t *)0x0) {
        uVar23 = (ulong)psVar7[uVar22];
      }
      uVar21 = uVar22;
      if (psVar8 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar8[uVar22];
      }
      uVar18 = uVar22;
      if (psVar9 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar9[uVar22];
      }
      uVar20 = uVar22;
      if (psVar10 != (sel_t *)0x0) {
        uVar20 = (ulong)psVar10[uVar22];
      }
      if ((((puVar11 == (unsigned_long *)0x0) ||
           ((puVar11[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) &&
          ((puVar12 == (unsigned_long *)0x0 || ((puVar12[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0))
          )) && ((puVar13 == (unsigned_long *)0x0 ||
                 ((puVar13[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)))) {
        bVar17 = *(uint *)(pdVar2 + uVar21 * 4) < *(uint *)(pdVar6 + uVar20 * 4) &&
                 *(uint *)(pdVar4 + uVar18 * 4) < *(uint *)(pdVar2 + uVar21 * 4);
      }
      else {
        bVar17 = false;
      }
      psVar14[iVar16] = (sel_t)uVar23;
      iVar16 = iVar16 + bVar17;
      psVar15[lVar19] = (sel_t)uVar23;
      lVar19 = lVar19 + (ulong)(bVar17 ^ 1);
      uVar22 = uVar22 + 1;
    } while (count != uVar22);
    return iVar16;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}